

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_indexed(FuncState *fs,expdesc *t,expdesc *k)

{
  int iVar1;
  expkind eVar2;
  
  if (k->k == VKSTR) {
    str2K(fs,k);
  }
  eVar2 = t->k;
  if (eVar2 == VUPVAL) {
    iVar1 = isKstr(fs,k);
    if (iVar1 == 0) {
      luaK_exp2anyreg(fs,t);
      eVar2 = t->k;
      goto LAB_00117909;
    }
  }
  else {
LAB_00117909:
    if ((eVar2 == VLOCAL) || (eVar2 != VUPVAL)) {
      (t->u).ind.t = (t->u).var.ridx;
      iVar1 = isKstr(fs,k);
      if (iVar1 == 0) {
        if (((k->k == VKINT) && (k->t == k->f)) && ((ulong)(k->u).ival < 0x100)) {
          (t->u).ind.idx = (short)(k->u).ival;
          eVar2 = VINDEXI;
        }
        else {
          iVar1 = luaK_exp2anyreg(fs,k);
          (t->u).ind.idx = (short)iVar1;
          eVar2 = VINDEXED;
        }
      }
      else {
        (t->u).ind.idx = (k->u).ind.idx;
        eVar2 = VINDEXSTR;
      }
      goto LAB_00117975;
    }
  }
  (t->u).ind.t = (t->u).var.ridx;
  (t->u).ind.idx = (k->u).ind.idx;
  eVar2 = VINDEXUP;
LAB_00117975:
  t->k = eVar2;
  return;
}

Assistant:

void luaK_indexed (FuncState *fs, expdesc *t, expdesc *k) {
  if (k->k == VKSTR)
    str2K(fs, k);
  lua_assert(!hasjumps(t) &&
             (t->k == VLOCAL || t->k == VNONRELOC || t->k == VUPVAL));
  if (t->k == VUPVAL && !isKstr(fs, k))  /* upvalue indexed by non 'Kstr'? */
    luaK_exp2anyreg(fs, t);  /* put it in a register */
  if (t->k == VUPVAL) {
    int temp = t->u.info;  /* upvalue index */
    lua_assert(isKstr(fs, k));
    t->u.ind.t = temp;  /* (can't do a direct assignment; values overlap) */
    t->u.ind.idx = k->u.info;  /* literal short string */
    t->k = VINDEXUP;
  }
  else {
    /* register index of the table */
    t->u.ind.t = (t->k == VLOCAL) ? t->u.var.ridx: t->u.info;
    if (isKstr(fs, k)) {
      t->u.ind.idx = k->u.info;  /* literal short string */
      t->k = VINDEXSTR;
    }
    else if (isCint(k)) {
      t->u.ind.idx = cast_int(k->u.ival);  /* int. constant in proper range */
      t->k = VINDEXI;
    }
    else {
      t->u.ind.idx = luaK_exp2anyreg(fs, k);  /* register */
      t->k = VINDEXED;
    }
  }
}